

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinObjectHasEx
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  HeapEntity *pHVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  undefined1 manifesting;
  allocator_type *in_RCX;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *pvVar5;
  byte bVar6;
  anon_union_8_3_4e909c26_for_v aVar7;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_88;
  undefined1 local_70 [52];
  Type local_3c [3];
  
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"objectHasEx","");
  local_3c[0] = OBJECT;
  local_3c[1] = STRING;
  local_3c[2] = 1;
  __l._M_len = 3;
  __l._M_array = local_3c;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_88,__l,in_RCX);
  pvVar5 = args;
  validateBuiltinArgs(this,loc,(string *)local_70,args,&local_88);
  manifesting = SUB81(pvVar5,0);
  if (local_88.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = pVVar1[1].v.h;
  objectFields((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_70,(Interpreter *)(pVVar1->v).h,(HeapObject *)(ulong)(pVVar1[2].v.b ^ 1),
               (bool)manifesting);
  if ((_Rb_tree_node_base *)local_70._24_8_ == (_Rb_tree_node_base *)(local_70 + 8)) {
    aVar7.h = (HeapEntity *)0x0;
  }
  else {
    bVar6 = 0;
    p_Var4 = (_Rb_tree_node_base *)local_70._24_8_;
    do {
      iVar3 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                        (*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           **)(p_Var4 + 1),
                         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(pHVar2 + 1));
      if (iVar3 == 0) {
        bVar6 = 1;
        break;
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)(local_70 + 8));
    aVar7._1_7_ = 0;
    aVar7.b = (bool)bVar6;
  }
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               *)local_70);
  (this->scratch).t = BOOLEAN;
  (this->scratch).v = aVar7;
  return (AST *)0x0;
}

Assistant:

const AST *builtinObjectHasEx(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(
            loc, "objectHasEx", args, {Value::OBJECT, Value::STRING, Value::BOOLEAN});
        const auto *obj = static_cast<const HeapObject *>(args[0].v.h);
        const auto *str = static_cast<const HeapString *>(args[1].v.h);
        bool include_hidden = args[2].v.b;
        bool found = false;
        for (const auto &field : objectFields(obj, !include_hidden)) {
            if (field->name == str->value) {
                found = true;
                break;
            }
        }
        scratch = makeBoolean(found);
        return nullptr;
    }